

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_utils.c
# Opt level: O0

uint32_t utf8_len(char *s,uint32_t nbytes)

{
  uint32_t uVar1;
  size_t sVar2;
  uint32_t local_24;
  uint32_t n;
  uint32_t len;
  uint32_t pos;
  uint32_t nbytes_local;
  char *s_local;
  
  len = nbytes;
  if (nbytes == 0) {
    sVar2 = strlen(s);
    len = (uint32_t)sVar2;
  }
  n = 0;
  local_24 = 0;
  while( true ) {
    if (len <= n) {
      return local_24;
    }
    local_24 = local_24 + 1;
    uVar1 = utf8_charbytes(s,n);
    if (uVar1 == 0) break;
    n = uVar1 + n;
  }
  return 0;
}

Assistant:

uint32_t utf8_len (const char *s, uint32_t nbytes) {
    if (nbytes == 0) nbytes = (uint32_t)strlen(s);
    
    uint32_t pos = 0;
    uint32_t len = 0;
    
    while (pos < nbytes) {
        ++len;
        uint32_t n = utf8_charbytes(s, pos);
        if (n == 0) return 0; // means error
        pos += n;
    }
    
    return len;
}